

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void float64_suite::test_min(void)

{
  value_type input [9];
  decoder decoder;
  return_type local_78;
  ulong local_70;
  uchar local_68 [16];
  decoder local_58;
  
  local_68[0] = 0xd7;
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\x10';
  local_68[8] = '\0';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[9]>
            (&local_58,(uchar (*) [9])local_68);
  local_78 = (return_type)CONCAT44(local_78._4_4_,local_58.current.code);
  local_70 = CONCAT44(local_70._4_4_,0xd7);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::float64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x37b,"void float64_suite::test_min()",&local_78,&local_70);
  local_78 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::float64>::decode(&local_58);
  local_70 = 0x10000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("decoder.value<token::float64>()","std::numeric_limits<token::float64::type>::min()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x37d,"void float64_suite::test_min()",&local_78,&local_70);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_78 = (return_type)CONCAT44(local_78._4_4_,local_58.current.code);
  local_70 = local_70 & 0xffffffff00000000;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x37f,"void float64_suite::test_min()",&local_78,&local_70);
  return;
}

Assistant:

void test_min()
{
    const value_type input[] = { token::code::float64, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x10, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::float64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::float64>(),
                              std::numeric_limits<token::float64::type>::min());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}